

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cpp
# Opt level: O2

string * __thiscall
duckdb::StackTrace::GetStacktracePointers_abi_cxx11_
          (string *__return_storage_ptr__,StackTrace *this,idx_t max_depth)

{
  unique_ptr<void_*[],_std::default_delete<void_*[]>,_true> uVar1;
  int iVar2;
  unique_ptr<void_*[],_std::default_delete<void_*[]>_> uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  unique_ptr<void_*[],_std::default_delete<void_*[]>,_true> callstack;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3._M_t.super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
  super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
  super__Head_base<0UL,_void_**,_false>._M_head_impl =
       (__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true>)
       operator_new__(-(ulong)((ulong)this >> 0x3d != 0) | (long)this * 8);
  callstack.super_unique_ptr<void_*[],_std::default_delete<void_*[]>_>._M_t.
  super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
  super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
  super__Head_base<0UL,_void_**,_false>._M_head_impl =
       (unique_ptr<void_*[],_std::default_delete<void_*[]>_>)
       (unique_ptr<void_*[],_std::default_delete<void_*[]>_>)
       uVar3._M_t.super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
       super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
       super__Head_base<0UL,_void_**,_false>._M_head_impl;
  iVar2 = NumericCastImpl<int,_unsigned_long,_false>::Convert((unsigned_long)this);
  iVar2 = backtrace(uVar3._M_t.super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
                    super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
                    super__Head_base<0UL,_void_**,_false>._M_head_impl,iVar2);
  uVar5 = 2;
  while( true ) {
    uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert(iVar2);
    if (uVar4 <= uVar5) break;
    if (__return_storage_ptr__->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    uVar1.super_unique_ptr<void_*[],_std::default_delete<void_*[]>_>._M_t.
    super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
    super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
    super__Head_base<0UL,_void_**,_false>._M_head_impl =
         callstack.super_unique_ptr<void_*[],_std::default_delete<void_*[]>_>._M_t.
         super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
         super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
         super__Head_base<0UL,_void_**,_false>._M_head_impl;
    unique_ptr<void_*[],_std::default_delete<void_*[]>,_true>::AssertNotNull
              (callstack.super_unique_ptr<void_*[],_std::default_delete<void_*[]>_>._M_t.
               super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
               super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
               super__Head_base<0UL,_void_**,_false>._M_head_impl ==
               (__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true>)0x0);
    ::std::__cxx11::to_string
              (&local_50,
               *(unsigned_long *)
                ((long)uVar1.super_unique_ptr<void_*[],_std::default_delete<void_*[]>_>._M_t.
                       super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
                       super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
                       super__Head_base<0UL,_void_**,_false>._M_head_impl + uVar5 * 8));
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_50);
    uVar5 = uVar5 + 1;
  }
  std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::~unique_ptr
            (&callstack.super_unique_ptr<void_*[],_std::default_delete<void_*[]>_>);
  return __return_storage_ptr__;
}

Assistant:

string StackTrace::GetStacktracePointers(idx_t max_depth) {
	string result;
	auto callstack = unique_ptr<void *[]>(new void *[max_depth]);
	int frames = backtrace(callstack.get(), NumericCast<int32_t>(max_depth));
	// skip two frames (these are always StackTrace::...)
	for (idx_t i = 2; i < NumericCast<idx_t>(frames); i++) {
		if (!result.empty()) {
			result += ";";
		}
		result += to_string(CastPointerToValue(callstack[i]));
	}
	return result;
}